

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O2

uint32_t helper_ssubaddx_arm(uint32_t a,uint32_t b,void *gep)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = ((int)b >> 0x10) + (int)(short)a;
  iVar1 = (int)~uVar3 >> 0x1f;
  iVar4 = ((int)a >> 0x10) - (int)(short)b;
  iVar2 = iVar1 * -3 + 0xc;
  if (iVar4 < 0) {
    iVar2 = iVar1 * -3;
  }
  *(int *)gep = iVar2;
  return uVar3 & 0xffff | iVar4 * 0x10000;
}

Assistant:

uint32_t HELPER(glue(PFX,subaddx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b >> 16, 0);
    SUB16(a >> 16, b, 1);
    SET_GE;
    return res;
}